

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_converter.h
# Opt level: O1

bool date::date_converter<date::rfc3339,_long,_void>::to_parts(time_t timepoint,parts *parts)

{
  undefined8 in_RAX;
  seconds_count sVar1;
  date_time dVar2;
  date_time local_18;
  
  local_18._7_1_ = SUB81((ulong)in_RAX >> 0x38,0);
  local_18.super_date.year = 0x7b2;
  local_18.super_date.month = '\x01';
  local_18.super_date.day = '\x01';
  local_18.super_time.hour = '\0';
  local_18.super_time.minute = '\0';
  local_18.super_time.second = '\0';
  sVar1 = calendar_helper::to_seconds_count(&local_18);
  dVar2 = calendar_helper::from_seconds_count(timepoint + sVar1);
  parts->year = dVar2.super_date.year;
  parts->month = dVar2.super_date.month;
  parts->day = dVar2.super_date.day;
  parts->hour = dVar2.super_time.hour;
  parts->minute = dVar2.super_time.minute;
  parts->second = dVar2.super_time.second;
  parts->nanosecond = 0;
  parts->offset_in_minutes = 0;
  return true;
}

Assistant:

static bool to_parts(std::time_t timepoint, rfc3339::parts& parts)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto dt = calendar_helper::from_seconds_count(epoch_offset + timepoint);
        parts.year     = dt.year;
        parts.month    = dt.month;
        parts.day      = dt.day;
        parts.hour     = dt.hour;
        parts.minute   = dt.minute;
        parts.second   = dt.second;
        parts.nanosecond        = 0;
        parts.offset_in_minutes = 0;
        return true;
    }